

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O2

void socketreceiver_read(_socketreceiver *x,int fd)

{
  char cVar1;
  _binbuf *x_00;
  uint uVar2;
  socklen_t *psVar3;
  _instanceinter *p_Var4;
  FILE *__stream;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  size_t size;
  ssize_t sVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  socklen_t *__addr_len;
  uint uVar13;
  uint uVar14;
  size_t size_00;
  uchar *__s;
  socklen_t fromaddrlen;
  
  p_Var4 = pd_maininstance.pd_inter;
  if (x->sr_udp == 0) {
    iVar5 = x->sr_inhead;
    iVar11 = 0x1000;
    if (iVar5 < x->sr_intail) {
      iVar11 = x->sr_intail + -1;
    }
    if (iVar11 == iVar5) {
      fwrite("pd: dropped message from gui\n",0x1d,1,_stderr);
      x->sr_inhead = 0;
      x->sr_intail = 0;
    }
    else {
      sVar8 = recv(fd,x->sr_inbuf + iVar5,(long)(iVar11 - iVar5),0);
      iVar5 = (int)sVar8;
      if (iVar5 < 1) {
        if (iVar5 < 0) {
          sys_sockerror("recv (tcp)");
        }
        __stream = _stderr;
        if ((pd_maininstance.pd_inter)->i_socketreceiver != x) {
          if (x->sr_notifier != (t_socketnotifier)0x0) {
            (*x->sr_notifier)(x->sr_owner,fd);
          }
          sys_rmpollfn(fd);
          socket_close(fd);
          return;
        }
        piVar9 = __errno_location();
        pcVar7 = strerror(*piVar9);
        fprintf(__stream,"read from GUI socket: %s; stopping\n",pcVar7);
        sys_bail(1);
      }
      uVar13 = iVar5 + x->sr_inhead;
      if (0xfff < (int)uVar13) {
        uVar13 = 0;
      }
      x->sr_inhead = uVar13;
      uVar12 = x->sr_intail;
      do {
        size_00 = 1;
        pcVar7 = x->sr_inbuf;
        bVar10 = true;
        psVar3 = &fromaddrlen;
        while( true ) {
          if ((!bVar10) && (uVar12 == uVar13)) {
            return;
          }
          cVar1 = pcVar7[(int)uVar12];
          *(char *)psVar3 = cVar1;
          if ((cVar1 == ';') && ((uVar12 == 0 || (pcVar7[(long)(int)uVar12 + -1] != '\\')))) break;
          uVar12 = uVar12 + 1 & 0xfff;
          size_00 = size_00 + 1;
          bVar10 = false;
          psVar3 = (socklen_t *)((long)psVar3 + 1);
        }
        binbuf_text((pd_maininstance.pd_inter)->i_inbinbuf,(char *)&fromaddrlen,size_00);
        if ((sys_debuglevel & 2U) != 0) {
          uVar14 = (uint)size_00;
          if ((socklen_t *)((long)psVar3 + 1) <= &fromaddrlen) {
            uVar14 = 0;
          }
          uVar2 = uVar14 - 2;
          if (fromaddrlen._1_1_ != '\n' || (char)fromaddrlen != '\r') {
            uVar2 = uVar14;
          }
          pcVar7 = "<< %.*s\n";
          if (stderr_isatty != 0) {
            pcVar7 = "\x1b[0;1;36m<< %.*s\x1b[0m\n";
          }
          if ((sys_debuglevel & 4U) == 0) {
            pcVar7 = "<< %.*s\n";
          }
          fprintf(_stderr,pcVar7,(ulong)uVar2);
        }
        x->sr_inhead = uVar13;
        x->sr_intail = uVar12 + 1 & 0xfff;
        if (x->sr_fromaddrfn != (t_socketfromaddrfn)0x0) {
          fromaddrlen = 0x80;
          iVar5 = getpeername(fd,(sockaddr *)x->sr_fromaddr,&fromaddrlen);
          if (iVar5 == 0) {
            (*x->sr_fromaddrfn)(x->sr_owner,x->sr_fromaddr);
          }
        }
        outlet_setstacklim();
        if (x->sr_socketreceivefn == (t_socketreceivefn)0x0) {
          binbuf_eval((pd_maininstance.pd_inter)->i_inbinbuf,(t_pd *)0x0,0,(t_atom *)0x0);
        }
        else {
          (*x->sr_socketreceivefn)(x->sr_owner,(pd_maininstance.pd_inter)->i_inbinbuf);
        }
        uVar13 = x->sr_inhead;
        uVar12 = x->sr_intail;
      } while (uVar13 != uVar12);
    }
  }
  else {
    __s = (pd_maininstance.pd_inter)->i_recvbuf;
    fromaddrlen = 0x80;
    uVar13 = 0;
    while( true ) {
      __addr_len = &fromaddrlen;
      if (x->sr_fromaddr == (sockaddr_storage *)0x0) {
        __addr_len = (socklen_t *)0x0;
      }
      uVar6 = recvfrom(fd,__s,0xffff,0,(sockaddr *)x->sr_fromaddr,__addr_len);
      uVar12 = (uint)uVar6;
      if ((int)uVar12 < 0) break;
      if (uVar12 != 0) {
        if (0xffff < uVar12) {
          post("warning: incoming UDP packet truncated from %d to %d bytes.",uVar6 & 0xffffffff,
               0xffff);
          uVar6 = 0xffff;
        }
        __s[uVar6 & 0xffffffff] = '\0';
        if (p_Var4->i_recvbuf[(uVar6 & 0xffffffff) - 1] == '\n') {
          pcVar7 = strchr((char *)__s,0x3b);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
          }
          if (x->sr_fromaddrfn != (t_socketfromaddrfn)0x0) {
            (*x->sr_fromaddrfn)(x->sr_owner,x->sr_fromaddr);
          }
          x_00 = (pd_maininstance.pd_inter)->i_inbinbuf;
          size = strlen((char *)__s);
          binbuf_text(x_00,(char *)__s,size);
          outlet_setstacklim();
          if (x->sr_socketreceivefn == (t_socketreceivefn)0x0) {
            bug("socketreceiver_getudp");
          }
          else {
            (*x->sr_socketreceivefn)(x->sr_owner,(pd_maininstance.pd_inter)->i_inbinbuf);
          }
        }
        uVar13 = uVar13 + (int)uVar6;
        if (0xffff < uVar13) {
          return;
        }
        iVar5 = socket_bytes_available(fd);
        if (iVar5 < 1) {
          return;
        }
      }
    }
    iVar5 = socket_errno_udp();
    if (iVar5 != 0) {
      sys_sockerror("recv (udp)");
      if (x->sr_notifier != (t_socketnotifier)0x0) {
        (*x->sr_notifier)(x->sr_owner,fd);
        sys_rmpollfn(fd);
        socket_close(fd);
      }
    }
  }
  return;
}

Assistant:

void socketreceiver_read(t_socketreceiver *x, int fd)
{
    if (x->sr_udp)   /* UDP ("datagram") socket protocol */
        socketreceiver_getudp(x, fd);
    else  /* TCP ("streaming") socket protocol */
    {
        char *semi;
        int readto =
            (x->sr_inhead >= x->sr_intail ? INBUFSIZE : x->sr_intail-1);
        int ret;

            /* the input buffer might be full. If so, drop the whole thing */
        if (readto == x->sr_inhead)
        {
            fprintf(stderr, "pd: dropped message from gui\n");
            x->sr_inhead = x->sr_intail = 0;
            readto = INBUFSIZE;
        }
        else
        {
            ret = (int)recv(fd, x->sr_inbuf + x->sr_inhead,
                readto - x->sr_inhead, 0);
            if (ret <= 0)
            {
                if (ret < 0)
                    sys_sockerror("recv (tcp)");
                if (x == INTER->i_socketreceiver)
                {
                    if (pd_this == &pd_maininstance)
                    {
                        fprintf(stderr, "read from GUI socket: %s; stopping\n",
                            strerror(errno));
                        sys_bail(1);
                    }
                    else
                    {
                        sys_rmpollfn(fd);
                        sys_closesocket(fd);
                        sys_stopgui();
                    }
                }
                else
                {
                    if (x->sr_notifier)
                        (*x->sr_notifier)(x->sr_owner, fd);
                    sys_rmpollfn(fd);
                    sys_closesocket(fd);
                }
            }
            else
            {
                x->sr_inhead += ret;
                if (x->sr_inhead >= INBUFSIZE) x->sr_inhead = 0;
                while (socketreceiver_doread(x))
                {
                    if (x->sr_fromaddrfn)
                    {
                        socklen_t fromaddrlen = sizeof(struct sockaddr_storage);
                        if(!getpeername(fd,
                                        (struct sockaddr *)x->sr_fromaddr,
                                        &fromaddrlen))
                            (*x->sr_fromaddrfn)(x->sr_owner,
                                (const void *)x->sr_fromaddr);
                    }
                    outlet_setstacklim();
                    if (x->sr_socketreceivefn)
                        (*x->sr_socketreceivefn)(x->sr_owner,
                            INTER->i_inbinbuf);
                    else binbuf_eval(INTER->i_inbinbuf, 0, 0, 0);
                    if (x->sr_inhead == x->sr_intail)
                        break;
                }
            }
        }
    }
}